

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O0

string * __thiscall
google::protobuf::internal::ArenaStringPtr::UnsafeMutablePointer_abi_cxx11_(ArenaStringPtr *this)

{
  bool bVar1;
  string *psVar2;
  LogMessage *pLVar3;
  LogMessage local_50;
  Voidify local_3d [20];
  byte local_29;
  LogMessage local_28;
  Voidify local_11;
  ArenaStringPtr *local_10;
  ArenaStringPtr *this_local;
  
  local_10 = this;
  bVar1 = TaggedStringPtr::IsMutable(&this->tagged_ptr_);
  local_29 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
               ,0x210,"tagged_ptr_.IsMutable()");
    local_29 = 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar3);
  }
  if ((local_29 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_28);
  }
  psVar2 = TaggedStringPtr::Get_abi_cxx11_(&this->tagged_ptr_);
  if (psVar2 == (string *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
               ,0x211,"tagged_ptr_.Get() != nullptr");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(local_3d,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  psVar2 = TaggedStringPtr::Get_abi_cxx11_(&this->tagged_ptr_);
  return psVar2;
}

Assistant:

inline std::string* ArenaStringPtr::UnsafeMutablePointer() {
  ABSL_DCHECK(tagged_ptr_.IsMutable());
  ABSL_DCHECK(tagged_ptr_.Get() != nullptr);
  return tagged_ptr_.Get();
}